

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pn.cpp
# Opt level: O3

int __thiscall DSDcc::PN_9_5::init(PN_9_5 *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  int i;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar1 = this->m_seed;
  uVar2 = 0;
  uVar3 = 0;
  do {
    uVar4 = (uint)uVar2 & 7;
    this->m_bitTable[uVar2] = (uchar)(uVar1 & 1);
    if ((uVar2 & 7) == 0) {
      uVar3 = uVar4;
    }
    uVar3 = uVar3 + ((uVar1 & 1) << ((byte)uVar4 ^ 7));
    if (uVar4 == 7) {
      this->m_byteTable[uVar2 >> 3 & 0x1fffffff] = (uchar)uVar3;
    }
    uVar1 = uVar1 >> 1 | ((uVar1 >> 4 ^ uVar1) & 1) << 8;
    uVar2 = uVar2 + 1;
  } while (uVar2 != 0x200);
  return uVar1;
}

Assistant:

void PN_9_5::init()
{
    unsigned char byte;
    unsigned int sr = m_seed;

    for (int i = 0; i < 512; i++)
    {
        if (i%8  == 0)
        {
            byte = 0;
        }

        unsigned int bit0 = (sr & 1);
        unsigned int bit4 = (sr & 0x10) >> 4;
        sr >>= 1;
        sr |= (bit4 ^ bit0) << 8;

        m_bitTable[i] = bit0;
        byte += bit0 << (7 - (i%8));

        if (i%8 == 7)
        {
            m_byteTable[i/8] = byte;
        }
    }

}